

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O0

Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  int iVar1;
  int iVar2;
  Bdc_Fun_t *pBVar3;
  uint local_48;
  uint local_44;
  int WeightAndR;
  int WeightAndL;
  int WeightOrR;
  int WeightOrL;
  int WeightAnd;
  int WeightOr;
  Bdc_Isf_t *pIsfR_local;
  Bdc_Isf_t *pIsfL_local;
  Bdc_Isf_t *pIsf_local;
  Bdc_Man_t *p_local;
  
  Bdc_IsfClean(p->pIsfOL);
  Bdc_IsfClean(p->pIsfOR);
  Bdc_IsfClean(p->pIsfAL);
  Bdc_IsfClean(p->pIsfAR);
  iVar1 = Bdc_DecomposeOr(p,pIsf,p->pIsfOL,p->pIsfOR);
  Bdc_IsfNot(pIsf);
  iVar2 = Bdc_DecomposeOr(p,pIsf,p->pIsfAL,p->pIsfAR);
  Bdc_IsfNot(pIsf);
  Bdc_IsfNot(p->pIsfAL);
  Bdc_IsfNot(p->pIsfAR);
  if ((iVar1 == 0) && (iVar2 == 0)) {
    Bdc_IsfCopy(pIsfL,p->pIsfOL);
    Bdc_IsfCopy(pIsfR,p->pIsfOR);
    p_local._4_4_ = BDC_TYPE_MUX;
  }
  else {
    if ((iVar1 == 0) && (iVar2 == 0)) {
      __assert_fail("WeightOr || WeightAnd",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                    ,0x1d7,
                    "Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                   );
    }
    WeightAndR = 0;
    WeightAndL = 0;
    if (iVar1 != 0) {
      if (p->pIsfOL->uUniq != 0) {
        Bdc_SuppMinimize(p,p->pIsfOL);
        pBVar3 = Bdc_TableLookup(p,p->pIsfOL);
        WeightAndL = (int)(pBVar3 != (Bdc_Fun_t *)0x0);
      }
      if (p->pIsfOR->uUniq != 0) {
        Bdc_SuppMinimize(p,p->pIsfOR);
        pBVar3 = Bdc_TableLookup(p,p->pIsfOR);
        WeightAndR = (int)(pBVar3 != (Bdc_Fun_t *)0x0);
      }
    }
    local_48 = 0;
    local_44 = 0;
    if (iVar2 != 0) {
      if (p->pIsfAL->uUniq != 0) {
        Bdc_SuppMinimize(p,p->pIsfAL);
        pBVar3 = Bdc_TableLookup(p,p->pIsfAL);
        local_44 = (uint)(pBVar3 != (Bdc_Fun_t *)0x0);
      }
      if (p->pIsfAR->uUniq != 0) {
        Bdc_SuppMinimize(p,p->pIsfAR);
        pBVar3 = Bdc_TableLookup(p,p->pIsfAR);
        local_48 = (uint)(pBVar3 != (Bdc_Fun_t *)0x0);
      }
    }
    if (local_44 + local_48 < (uint)(WeightAndL + WeightAndR)) {
      p->numReuse = p->numReuse + 1;
      p->numOrs = p->numOrs + 1;
      Bdc_IsfCopy(pIsfL,p->pIsfOL);
      Bdc_IsfCopy(pIsfR,p->pIsfOR);
      p_local._4_4_ = BDC_TYPE_OR;
    }
    else if ((uint)(WeightAndL + WeightAndR) < local_44 + local_48) {
      p->numReuse = p->numReuse + 1;
      p->numAnds = p->numAnds + 1;
      Bdc_IsfCopy(pIsfL,p->pIsfAL);
      Bdc_IsfCopy(pIsfR,p->pIsfAR);
      p_local._4_4_ = BDC_TYPE_AND;
    }
    else if (iVar2 < iVar1) {
      if (iVar1 < 1000) {
        p->numWeaks = p->numWeaks + 1;
      }
      p->numOrs = p->numOrs + 1;
      Bdc_IsfCopy(pIsfL,p->pIsfOL);
      Bdc_IsfCopy(pIsfR,p->pIsfOR);
      p_local._4_4_ = BDC_TYPE_OR;
    }
    else {
      if (iVar2 < 1000) {
        p->numWeaks = p->numWeaks + 1;
      }
      p->numAnds = p->numAnds + 1;
      Bdc_IsfCopy(pIsfL,p->pIsfAL);
      Bdc_IsfCopy(pIsfR,p->pIsfAR);
      p_local._4_4_ = BDC_TYPE_AND;
    }
  }
  return p_local._4_4_;
}

Assistant:

Bdc_Type_t Bdc_DecomposeStep( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    int WeightOr, WeightAnd, WeightOrL, WeightOrR, WeightAndL, WeightAndR;

    Bdc_IsfClean( p->pIsfOL );
    Bdc_IsfClean( p->pIsfOR );
    Bdc_IsfClean( p->pIsfAL );
    Bdc_IsfClean( p->pIsfAR );

    // perform OR decomposition
    WeightOr = Bdc_DecomposeOr( p, pIsf, p->pIsfOL, p->pIsfOR );

    // perform AND decomposition
    Bdc_IsfNot( pIsf );
    WeightAnd = Bdc_DecomposeOr( p, pIsf, p->pIsfAL, p->pIsfAR );
    Bdc_IsfNot( pIsf );
    Bdc_IsfNot( p->pIsfAL );
    Bdc_IsfNot( p->pIsfAR );

    // check the case when decomposition does not exist
    if ( WeightOr == 0 && WeightAnd == 0 )
    {
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_MUX;
    }
    // check the hash table
    assert( WeightOr || WeightAnd );
    WeightOrL = WeightOrR = 0;
    if ( WeightOr )
    {
        if ( p->pIsfOL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOL );
            WeightOrL = (Bdc_TableLookup(p, p->pIsfOL) != NULL);
        }
        if ( p->pIsfOR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOR );
            WeightOrR = (Bdc_TableLookup(p, p->pIsfOR) != NULL);
        }
    }
    WeightAndL = WeightAndR = 0;
    if ( WeightAnd )
    {
        if ( p->pIsfAL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAL );
            WeightAndL = (Bdc_TableLookup(p, p->pIsfAL) != NULL);
        }
        if ( p->pIsfAR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAR );
            WeightAndR = (Bdc_TableLookup(p, p->pIsfAR) != NULL);
        }
    }

    // check if there is any reuse for the components
    if ( WeightOrL + WeightOrR > WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightOrL + WeightOrR < WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numAnds++;
        Bdc_IsfCopy( pIsfL, p->pIsfAL );
        Bdc_IsfCopy( pIsfR, p->pIsfAR );
        return BDC_TYPE_AND; 
    }

    // compare the two-component costs
    if ( WeightOr > WeightAnd )
    {
        if ( WeightOr < BDC_SCALE )
            p->numWeaks++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightAnd < BDC_SCALE )
        p->numWeaks++;
    p->numAnds++;
    Bdc_IsfCopy( pIsfL, p->pIsfAL );
    Bdc_IsfCopy( pIsfR, p->pIsfAR );
    return BDC_TYPE_AND;
}